

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

Image * vera::packSprite(Image *__return_storage_ptr__,
                        vector<vera::Image,_std::allocator<vera::Image>_> *_images)

{
  pointer pIVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  thread *t_1;
  long lVar9;
  pointer ptVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  thread t;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  long *local_78;
  thread local_70;
  long local_68;
  long local_60;
  vector<std::thread,_std::allocator<std::thread>_> local_58;
  ulong local_40;
  vector<vera::Image,_std::allocator<vera::Image>_> *local_38;
  
  Image::Image(__return_storage_ptr__);
  pIVar1 = (_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    iVar3 = (*pIVar1->_vptr_Image[6])();
    iVar4 = (*((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
               super__Vector_impl_data._M_start)->_vptr_Image[7])();
    iVar5 = (*((_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
               super__Vector_impl_data._M_start)->_vptr_Image[8])();
    fVar13 = (float)(ulong)(((long)(_images->
                                   super__Vector_base<vera::Image,_std::allocator<vera::Image>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(_images->
                                   super__Vector_base<vera::Image,_std::allocator<vera::Image>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 4) *
                           0x6db6db6db6db6db7);
    local_60 = (long)iVar3;
    local_68 = (long)iVar4;
    if (fVar13 < 0.0) {
      fVar13 = sqrtf(fVar13);
    }
    else {
      fVar13 = SQRT(fVar13);
    }
    fVar13 = ceilf(fVar13);
    local_40 = (long)(fVar13 - 9.223372e+18) & (long)fVar13 >> 0x3f | (long)fVar13;
    Image::allocate(__return_storage_ptr__,local_40 * local_60,local_40 * local_68,(long)iVar5);
    local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = std::thread::hardware_concurrency();
    uVar7 = ((long)(_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(_images->super__Vector_base<vera::Image,_std::allocator<vera::Image>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    uVar12 = (ulong)iVar3;
    uVar6 = uVar7 / uVar12;
    lVar9 = 0;
    local_38 = _images;
    do {
      local_70._M_id._M_thread = (id)0;
      local_78 = (long *)operator_new(0x40);
      lVar8 = lVar9 * uVar6;
      uVar11 = 0;
      if (iVar3 + -1 == lVar9) {
        uVar11 = uVar7 % uVar12;
      }
      *local_78 = (long)&PTR___State_003ec4e0;
      local_78[1] = (long)local_38;
      local_78[2] = (long)__return_storage_ptr__;
      local_78[3] = lVar8;
      local_78[4] = uVar11 + lVar8 + uVar6;
      local_78[5] = local_60;
      local_78[6] = local_68;
      local_78[7] = local_40;
      std::thread::_M_start_thread(&local_70,&local_78,0);
      if (local_78 != (long *)0x0) {
        (**(code **)(*local_78 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_58,&local_70);
      ptVar2 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_70._M_id._M_thread != 0) {
        std::terminate();
      }
      lVar9 = lVar9 + 1;
      ptVar10 = local_58.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar12 + (uVar12 == 0) != lVar9);
    for (; ptVar10 != ptVar2; ptVar10 = ptVar10 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

Image packSprite( const std::vector<Image>& _images ) {
    Image out;

    if (_images.size() == 0)
        return out;

    // Let's asume they are all equal
    size_t layerWidth = _images[0].getWidth();
    size_t layerHeight = _images[0].getHeight();
    size_t layerChannels = _images[0].getChannels();

    size_t layers_per_side = std::ceil( std::sqrt( float(_images.size()) ));
    size_t width = layerWidth * layers_per_side;
    size_t height = layerHeight * layers_per_side;
    size_t channels = layerChannels;

    out.allocate(width, height, channels);

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _images.size() / nThreads;
    size_t layersLeftOver = _images.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&_images, &out, start_layer, end_layer, layerWidth, layerHeight, layers_per_side ]() {
                for (size_t z = start_layer; z < end_layer; z++)
                for (size_t y = 0; y < layerHeight; y++)
                for (size_t x = 0; x < layerWidth; x++) {
                    size_t layerX = (z % layers_per_side) * layerWidth; 
                    size_t layerY = floor(z / layers_per_side) * layerHeight;
                    out.setColor(   out.getIndex(layerX + x, layerY + y), 
                                    _images[z].getColor( _images[z].getIndex(x, y) ));
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return out;
}